

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

int64 __thiscall TTD::EventLog::GetPreviousSnapshotInterval(EventLog *this,int64 currentSnapTime)

{
  long lVar1;
  long unaff_R12;
  bool bVar2;
  undefined1 local_48 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_48,&this->m_eventList);
  bVar2 = local_48 == (undefined1  [8])0x0;
  if (!bVar2) {
    do {
      if (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8)) {
        return -1;
      }
      if ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink) {
        return -1;
      }
      if (((bVar2) || (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8))) ||
         ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink)) {
        TTDAbort_unrecoverable_error("Iterator is invalid!!!");
      }
      bVar2 = true;
      if (*(int *)(*(byte **)((long)local_48 + 0x10) + (long)iter.m_currLink) == 1) {
        lVar1 = *(long *)(*(byte **)((long)local_48 + 0x10) + 0x10 + (long)iter.m_currLink);
        bVar2 = currentSnapTime <= lVar1;
        if (lVar1 < currentSnapTime) {
          unaff_R12 = lVar1;
        }
      }
      if (!bVar2) {
        return unaff_R12;
      }
      TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_48);
      bVar2 = local_48 == (undefined1  [8])0x0;
    } while (!bVar2);
  }
  return -1;
}

Assistant:

int64 EventLog::GetPreviousSnapshotInterval(int64 currentSnapTime) const
    {
        //move the iterator to the current snapshot just before the event
        for(auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly(); iter.IsValid(); iter.MovePrevious_ReplayOnly())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(snapEvent->RestoreTimestamp < currentSnapTime)
                {
                    return snapEvent->RestoreTimestamp;
                }
            }
        }

        return -1;
    }